

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::CallsAccessor(Instr *this,PropertySymOpnd *methodOpnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_29;
  PropertySymOpnd *methodOpnd_local;
  Instr *this_local;
  
  if (methodOpnd == (PropertySymOpnd *)0x0) {
    bVar2 = CallsGetter(this);
    local_29 = true;
    if (!bVar2) {
      local_29 = CallsSetter(this);
    }
    this_local._7_1_ = local_29;
  }
  else {
    bVar2 = PropertySymOpnd::HasObjTypeSpecFldInfo(methodOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xe7b,"(methodOpnd->HasObjTypeSpecFldInfo())",
                         "methodOpnd->HasObjTypeSpecFldInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_local._7_1_ = PropertySymOpnd::UsesAccessor(methodOpnd);
  }
  return this_local._7_1_;
}

Assistant:

bool Instr::CallsAccessor(IR::PropertySymOpnd * methodOpnd)
{
    if (methodOpnd)
    {
        Assert(methodOpnd->HasObjTypeSpecFldInfo());
        return methodOpnd->UsesAccessor();
    }

    return CallsGetter() || CallsSetter();
}